

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::PartialOccluderCullCase::genOccluderGeometry
          (ObjectData *__return_storage_ptr__,PartialOccluderCullCase *this)

{
  vector<float,_std::allocator<float>_> local_100;
  ProgramSources local_e8;
  PartialOccluderCullCase *local_18;
  PartialOccluderCullCase *this_local;
  
  local_18 = this;
  this_local = (PartialOccluderCullCase *)__return_storage_ptr__;
  Utils::getBaseShader();
  Utils::getPartScreenQuad(&local_100,this->m_coverage,0.2);
  ObjectData::ObjectData(__return_storage_ptr__,&local_e8,&local_100);
  std::vector<float,_std::allocator<float>_>::~vector(&local_100);
  glu::ProgramSources::~ProgramSources(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccluderGeometry			(void) const { return ObjectData(Utils::getBaseShader(), Utils::getPartScreenQuad(m_coverage, 0.2f)); }